

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heightmap.c
# Opt level: O0

void generate_heightmap__circle(float *center_x,float *center_y,float *size,float *displacement)

{
  int iVar1;
  uint uVar2;
  float sign;
  float *displacement_local;
  float *size_local;
  float *center_y_local;
  float *center_x_local;
  
  iVar1 = rand();
  *center_x = ((float)iVar1 * 10.0) / 2.1474836e+09;
  iVar1 = rand();
  *center_y = ((float)iVar1 * 10.0) / 2.1474836e+09;
  iVar1 = rand();
  *size = ((float)iVar1 * 5.0) / 2.1474836e+09;
  iVar1 = rand();
  uVar2 = -(uint)(((float)iVar1 * 1.0) / 2.1474836e+09 < 0.3);
  iVar1 = rand();
  *displacement =
       ((float)(~uVar2 & 0x3f800000 | uVar2 & 0xbf800000) * (float)iVar1 * 1.0) / 2.1474836e+09;
  return;
}

Assistant:

static void generate_heightmap__circle(float* center_x, float* center_y,
        float* size, float* displacement)
{
    float sign;
    /* random value for element in between [0-1.0] */
    *center_x = (MAP_SIZE * rand()) / (1.0f * RAND_MAX);
    *center_y = (MAP_SIZE * rand()) / (1.0f * RAND_MAX);
    *size = (MAX_CIRCLE_SIZE * rand()) / (1.0f * RAND_MAX);
    sign = (1.0f * rand()) / (1.0f * RAND_MAX);
    sign = (sign < DISPLACEMENT_SIGN_LIMIT) ? -1.0f : 1.0f;
    *displacement = (sign * (MAX_DISPLACEMENT * rand())) / (1.0f * RAND_MAX);
}